

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void wipe_monster_lore(monster_race *race,monster_lore *lore)

{
  monster_drop *pmVar1;
  monster_friends *pmVar2;
  monster_friends_base *pmVar3;
  monster_mimic *pmVar4;
  monster_blow *__s;
  _Bool *__s_00;
  monster_drop *p;
  monster_friends *p_00;
  monster_friends_base *p_01;
  monster_mimic *p_02;
  
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x17f,
                  "void wipe_monster_lore(const struct monster_race *, struct monster_lore *)");
  }
  if (lore == (monster_lore *)0x0) {
    __assert_fail("lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x180,
                  "void wipe_monster_lore(const struct monster_race *, struct monster_lore *)");
  }
  p = lore->drops;
  while (p != (monster_drop *)0x0) {
    pmVar1 = p->next;
    mem_free(p);
    p = pmVar1;
  }
  p_00 = lore->friends;
  while (p_00 != (monster_friends *)0x0) {
    pmVar2 = p_00->next;
    mem_free(p_00);
    p_00 = pmVar2;
  }
  p_01 = lore->friends_base;
  while (p_01 != (monster_friends_base *)0x0) {
    pmVar3 = p_01->next;
    mem_free(p_01);
    p_01 = pmVar3;
  }
  p_02 = lore->mimic_kinds;
  while (p_02 != (monster_mimic *)0x0) {
    pmVar4 = p_02->next;
    mem_free(p_02);
    p_02 = pmVar4;
  }
  __s = lore->blows;
  memset(__s,0,(ulong)z_info->mon_blows_max * 0x30);
  __s_00 = lore->blow_known;
  memset(__s_00,0,(ulong)z_info->mon_blows_max);
  lore->drop_gold = '\0';
  lore->drop_item = '\0';
  lore->cast_innate = '\0';
  lore->cast_spell = '\0';
  *(undefined4 *)&lore->field_0x14 = 0;
  lore->blows = (monster_blow *)0x0;
  lore->blow_known = (_Bool *)0x0;
  lore->armour_known = false;
  lore->drop_known = false;
  lore->sleep_known = false;
  lore->spell_freq_known = false;
  lore->innate_freq_known = false;
  *(undefined3 *)&lore->field_0x6d = 0;
  lore->ridx = L'\0';
  lore->sights = 0;
  lore->deaths = 0;
  lore->pkills = 0;
  lore->thefts = 0;
  lore->tkills = 0;
  lore->wake = '\0';
  lore->ignore = '\0';
  lore->flags[0] = '\0';
  lore->flags[1] = '\0';
  lore->flags[2] = '\0';
  lore->flags[3] = '\0';
  lore->flags[4] = '\0';
  lore->flags[5] = '\0';
  lore->flags[6] = '\0';
  lore->flags[7] = '\0';
  *(undefined8 *)(lore->flags + 8) = 0;
  *(undefined8 *)(lore->spell_flags + 5) = 0;
  lore->drops = (monster_drop *)0x0;
  lore->friends = (monster_friends *)0x0;
  lore->friends_base = (monster_friends_base *)0x0;
  lore->mimic_kinds = (monster_mimic *)0x0;
  *(undefined8 *)&lore->all_known = 0;
  lore->blows = __s;
  lore->blow_known = __s_00;
  return;
}

Assistant:

void wipe_monster_lore(const struct monster_race *race, struct monster_lore *lore)
{
	struct monster_blow *blows;
	bool *blow_known;
	struct monster_drop *d;
	struct monster_friends *f;
	struct monster_friends_base *fb;
	struct monster_mimic *mk;

	assert(race);
	assert(lore);

	d = lore->drops;
	while (d) {
		struct monster_drop *dn = d->next;
		mem_free(d);
		d = dn;
	}
	f = lore->friends;
	while (f) {
		struct monster_friends *fn = f->next;
		mem_free(f);
		f = fn;
	}
	fb = lore->friends_base;
	while (fb) {
		struct monster_friends_base *fbn = fb->next;
		mem_free(fb);
		fb = fbn;
	}
	mk = lore->mimic_kinds;
	while (mk) {
		struct monster_mimic *mkn = mk->next;
		mem_free(mk);
		mk = mkn;
	}
	/*
	 * Keep the blows and blow_known pointers - other code assumes they
	 * are not NULL.  Wipe the pointed to memory.
	 */
	blows = lore->blows;
	memset(blows, 0, z_info->mon_blows_max * sizeof(*blows));
	blow_known = lore->blow_known;
	memset(blow_known, 0, z_info->mon_blows_max * sizeof(*blow_known));
	memset(lore, 0, sizeof(*lore));
	lore->blows = blows;
	lore->blow_known = blow_known;
}